

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.h
# Opt level: O0

void __thiscall Assimp::AC3DImporter::Object::Object(Object *this)

{
  allocator<char> local_25 [20];
  allocator<char> local_11;
  Object *local_10;
  Object *this_local;
  
  this->type = World;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->name,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  (this->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::vector
            (&this->children);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->texture,"",local_25);
  std::allocator<char>::~allocator(local_25);
  aiVector2t<float>::aiVector2t(&this->texRepeat,1.0,1.0);
  aiVector2t<float>::aiVector2t(&this->texOffset,0.0,0.0);
  aiMatrix3x3t<float>::aiMatrix3x3t(&this->rotation);
  aiVector3t<float>::aiVector3t(&this->translation);
  memset(&this->vertices,0,0x18);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->vertices);
  memset(&this->surfaces,0,0x18);
  std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>::vector
            (&this->surfaces);
  this->numRefs = 0;
  this->subDiv = 0;
  this->crease = 0.0;
  return;
}

Assistant:

Object()
            :   type    (World)
            ,   name( "" )
            ,   children()
            ,   texture( "" )
            ,   texRepeat( 1.f, 1.f )
            ,   texOffset( 0.0f, 0.0f )
            ,   rotation()
            ,   translation()
            ,   vertices()
            ,   surfaces()
            ,   numRefs (0)
            ,   subDiv  (0)
            ,   crease()
        {}